

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.c
# Opt level: O2

exr_result_t
internal_validate_next_chunk
          (exr_encode_pipeline_t *encode,_internal_exr_context *pctxt,_internal_exr_part *part)

{
  exr_result_t eVar1;
  uint uVar2;
  uint local_1c;
  
  if (pctxt->cur_output_part != encode->part_index) {
    eVar1 = (*pctxt->standard_error)(pctxt,0x18);
    return eVar1;
  }
  local_1c = 0xffffffff;
  if ((part->storage_mode | EXR_STORAGE_DEEP_SCANLINE) == EXR_STORAGE_DEEP_TILED) {
    eVar1 = validate_and_compute_tile_chunk_off
                      (pctxt,part,(encode->chunk).start_x,(encode->chunk).start_y,
                       (uint)(encode->chunk).level_x,(uint)(encode->chunk).level_y,
                       (int32_t *)&local_1c);
    uVar2 = local_1c;
    if (eVar1 != 0) {
      return eVar1;
    }
  }
  else {
    uVar2 = (encode->chunk).start_y - (part->data_window).min.field_0.field_0.y;
    if (1 < part->lines_per_chunk) {
      uVar2 = (int)uVar2 / (int)part->lines_per_chunk;
    }
  }
  if (-1 < (int)uVar2 && (int)uVar2 < part->chunk_count) {
    if ((part->lineorder != EXR_LINEORDER_RANDOM_Y) && (pctxt->last_output_chunk != uVar2 - 1)) {
      eVar1 = (*pctxt->print_error)
                        (pctxt,0x19,"Attempt to write chunk %d, but last output chunk is %d",
                         (ulong)uVar2,(ulong)(uint)pctxt->last_output_chunk,pctxt->print_error);
      return eVar1;
    }
    return 0;
  }
  eVar1 = (*pctxt->print_error)
                    (pctxt,3,"Chunk index for scanline %d in chunk %d outside chunk count %d",
                     (ulong)(uint)(encode->chunk).start_y,(ulong)uVar2);
  return eVar1;
}

Assistant:

exr_result_t
internal_validate_next_chunk (
    exr_encode_pipeline_t*              encode,
    const struct _internal_exr_context* pctxt,
    const struct _internal_exr_part*    part)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    int          cidx, lpc;

    if (pctxt->cur_output_part != encode->part_index)
        return pctxt->standard_error (pctxt, EXR_ERR_INCORRECT_PART);

    cidx = -1;

    if (part->storage_mode == EXR_STORAGE_TILED ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        rv = validate_and_compute_tile_chunk_off (
            pctxt,
            part,
            encode->chunk.start_x,
            encode->chunk.start_y,
            encode->chunk.level_x,
            encode->chunk.level_y,
            &cidx);
    }
    else
    {
        lpc  = part->lines_per_chunk;
        cidx = (encode->chunk.start_y - part->data_window.min.y);
        if (lpc > 1) cidx /= lpc;

        //if (part->lineorder == EXR_LINEORDER_DECREASING_Y)
        //{
        //    cidx = part->chunk_count - (cidx + 1);
        //}
    }

    if (rv == EXR_ERR_SUCCESS)
    {
        if (cidx < 0 || cidx >= part->chunk_count)
        {
            rv = pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Chunk index for scanline %d in chunk %d outside chunk count %d",
                encode->chunk.start_y,
                cidx,
                part->chunk_count);
        }
        else if (
            part->lineorder != EXR_LINEORDER_RANDOM_Y &&
            pctxt->last_output_chunk != (cidx - 1))
        {
            rv = pctxt->print_error (
                pctxt,
                EXR_ERR_INCORRECT_CHUNK,
                "Attempt to write chunk %d, but last output chunk is %d",
                cidx,
                pctxt->last_output_chunk);
        }
    }
    return rv;
}